

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclUtil.c
# Opt level: O1

Vec_Int_t * Abc_SclExtractBarBufs(Abc_Ntk_t *pNtk)

{
  uint uVar1;
  uint uVar2;
  long *plVar3;
  Mio_Gate_t *pMVar4;
  Vec_Int_t *pVVar5;
  int *piVar6;
  Vec_Ptr_t *pVVar7;
  int iVar8;
  long lVar9;
  
  pMVar4 = Mio_LibraryReadBuf((Mio_Library_t *)pNtk->pManFunc);
  if (pMVar4 == (Mio_Gate_t *)0x0) {
    puts("Cannot find buffer in the current library. Quitting.");
    pVVar5 = (Vec_Int_t *)0x0;
  }
  else {
    pVVar5 = (Vec_Int_t *)malloc(0x10);
    pVVar5->nCap = 100;
    pVVar5->nSize = 0;
    piVar6 = (int *)malloc(400);
    pVVar5->pArray = piVar6;
    pVVar7 = pNtk->vObjs;
    if (0 < pVVar7->nSize) {
      lVar9 = 0;
      do {
        plVar3 = (long *)pVVar7->pArray[lVar9];
        if ((((plVar3 != (long *)0x0) && (*(int *)(*plVar3 + 4) == 4)) &&
            ((*(uint *)((long)plVar3 + 0x14) & 0xf) == 7)) &&
           ((*(int *)((long)plVar3 + 0x1c) == 1 && (plVar3[7] == 0)))) {
          if (plVar3[7] != 0) {
            __assert_fail("pObj->pData == NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclUtil.c"
                          ,0x12d,"Vec_Int_t *Abc_SclExtractBarBufs(Abc_Ntk_t *)");
          }
          plVar3[7] = (long)pMVar4;
          uVar1 = pVVar5->nSize;
          uVar2 = pVVar5->nCap;
          if (uVar1 == uVar2) {
            if ((int)uVar2 < 0x10) {
              if (pVVar5->pArray == (int *)0x0) {
                piVar6 = (int *)malloc(0x40);
              }
              else {
                piVar6 = (int *)realloc(pVVar5->pArray,0x40);
              }
              pVVar5->pArray = piVar6;
              iVar8 = 0x10;
            }
            else {
              iVar8 = uVar2 * 2;
              if (iVar8 <= (int)uVar2) goto LAB_00478b8b;
              if (pVVar5->pArray == (int *)0x0) {
                piVar6 = (int *)malloc((ulong)uVar2 << 3);
              }
              else {
                piVar6 = (int *)realloc(pVVar5->pArray,(ulong)uVar2 << 3);
              }
              pVVar5->pArray = piVar6;
            }
            if (piVar6 == (int *)0x0) {
              __assert_fail("p->pArray",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
            }
            pVVar5->nCap = iVar8;
          }
LAB_00478b8b:
          pVVar5->nSize = uVar1 + 1;
          pVVar5->pArray[(int)uVar1] = (int)lVar9;
        }
        lVar9 = lVar9 + 1;
        pVVar7 = pNtk->vObjs;
      } while (lVar9 < pVVar7->nSize);
    }
  }
  return pVVar5;
}

Assistant:

Vec_Int_t * Abc_SclExtractBarBufs( Abc_Ntk_t * pNtk )
{
    Vec_Int_t * vBufs;
    Mio_Gate_t * pBuffer;
    Abc_Obj_t * pObj; int i;
    pBuffer = Mio_LibraryReadBuf( (Mio_Library_t *)pNtk->pManFunc );
    if ( pBuffer == NULL )
    {
        printf( "Cannot find buffer in the current library. Quitting.\n" );
        return NULL;
    }
    vBufs = Vec_IntAlloc( 100 );
    Abc_NtkForEachBarBuf( pNtk, pObj, i )
    {
        assert( pObj->pData == NULL );
        pObj->pData = pBuffer;
        Vec_IntPush( vBufs, i );
    }
    return vBufs;
}